

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi_lmo1.cpp
# Opt level: O2

int256_t * __thiscall primesum::pi_lmo1(int256_t *__return_storage_ptr__,primesum *this,int128_t x)

{
  long lVar1;
  long lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 x_00 [16];
  undefined1 x_01 [16];
  undefined1 x_02 [16];
  undefined1 x_03 [16];
  undefined1 x_04 [16];
  __int128 *__return_storage_ptr___00;
  int64_t iVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  primesum *in_RDX;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  __int128 *p_Var14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  undefined1 auVar18 [16];
  undefined8 in_stack_fffffffffffffe88;
  undefined8 in_stack_fffffffffffffe90;
  long lVar19;
  int256_t phi;
  long local_140;
  ulong local_138;
  ulong local_130;
  ulong local_128;
  vector<int,_std::allocator<int>_> primes;
  int256_t p2;
  vector<int,_std::allocator<int>_> mu;
  vector<int,_std::allocator<int>_> lpf;
  int256_t local_78;
  int256_t local_58;
  
  lVar9 = 1;
  if (-(long)in_RDX < (long)(ulong)((primesum *)0x1 < this)) {
    auVar18._8_8_ = in_stack_fffffffffffffe90;
    auVar18._0_8_ = in_stack_fffffffffffffe88;
    __return_storage_ptr___00 = iroot<3,__int128>((__int128 *)this,in_RDX,(__int128)auVar18);
    iVar5 = pi_legendre((int64_t)__return_storage_ptr___00,1);
    if ((long)__return_storage_ptr___00 < 0xd) {
      lVar6 = (long)*(int *)(PhiTiny::pi + (long)__return_storage_ptr___00 * 4);
    }
    else {
      lVar6 = 6;
    }
    generate_primes(&primes,(int64_t)__return_storage_ptr___00);
    generate_lpf(&lpf,(int64_t)__return_storage_ptr___00);
    generate_moebius(&mu,(int64_t)__return_storage_ptr___00);
    local_128 = 0;
    p_Var14 = (__int128 *)0x0;
    if (0 < (long)__return_storage_ptr___00) {
      p_Var14 = __return_storage_ptr___00;
    }
    local_140 = 0;
    local_138 = 0;
    local_130 = 0;
    lVar19 = lVar6;
    for (; lVar9 - (long)p_Var14 != 1; lVar9 = lVar9 + 1) {
      if (primes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar6] <
          lpf.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
          [lVar9]) {
        auVar18 = __udivti3(this);
        x_00._8_8_ = lVar19;
        x_00._0_8_ = in_stack_fffffffffffffe88;
        phi_sum(&p2,auVar18._0_8_,(int128_t)x_00,auVar18._8_8_);
        int256_t::operator*(&phi,&p2,mu.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start[lVar9] * lVar9);
        bVar15 = CARRY8(local_128,(ulong)phi.high);
        uVar7 = local_128 + (ulong)phi.high;
        bVar16 = CARRY8(local_138,(ulong)phi.low);
        local_138 = local_138 + (ulong)phi.low;
        bVar17 = CARRY8(local_130,phi.low._8_8_);
        uVar11 = local_130 + phi.low._8_8_;
        local_130 = uVar11 + bVar16;
        uVar11 = (ulong)(bVar17 || CARRY8(uVar11,(ulong)bVar16));
        local_128 = uVar7 + uVar11;
        local_140 = local_140 + phi.high._8_8_ + (ulong)bVar15 + (ulong)CARRY8(uVar7,uVar11);
      }
    }
    uVar11 = 0;
    lVar9 = 0;
    uVar7 = 0;
    uVar13 = 0;
    while (lVar1 = lVar6 + 1, lVar1 < iVar5) {
      p_Var14 = (__int128 *)
                ((long)__return_storage_ptr___00 /
                 (long)primes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar1] + 1);
      lVar19 = lVar6;
      for (lVar12 = (long)p_Var14 >> 0x3f;
          lVar2 = ((long)__return_storage_ptr___00 >> 0x3f) - lVar12, lVar6 = lVar1,
          (SBORROW8((long)__return_storage_ptr___00 >> 0x3f,lVar12) !=
          SBORROW8(lVar2,(ulong)(__return_storage_ptr___00 < p_Var14))) ==
          (long)(lVar2 - (ulong)(__return_storage_ptr___00 < p_Var14)) < 0;
          lVar12 = lVar12 + (ulong)bVar15) {
        if (primes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar1] <
            lpf.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[(long)p_Var14]) {
          uVar8 = (ulong)primes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar1];
          auVar3._8_8_ = 0;
          auVar3._0_8_ = p_Var14;
          auVar4._8_8_ = 0;
          auVar4._0_8_ = uVar8;
          auVar18 = __divti3(this,in_RDX,SUB168(auVar3 * auVar4,0),
                             uVar8 * lVar12 + SUB168(auVar3 * auVar4,8) +
                             ((long)uVar8 >> 0x3f) * (long)p_Var14);
          x_01._8_8_ = lVar19;
          x_01._0_8_ = in_stack_fffffffffffffe88;
          phi_sum(&p2,auVar18._0_8_,(int128_t)x_01,auVar18._8_8_);
          x_02._8_8_ = lVar19;
          x_02._0_8_ = in_stack_fffffffffffffe88;
          int256_t::operator*(&phi,&p2,(__int128)x_02);
          bVar15 = uVar11 < (ulong)phi.high;
          uVar10 = uVar11 - (ulong)phi.high;
          bVar16 = uVar7 < (ulong)phi.low;
          uVar7 = uVar7 - (ulong)phi.low;
          bVar17 = uVar13 < phi.low._8_8_;
          uVar11 = uVar13 - phi.low._8_8_;
          uVar13 = uVar11 - bVar16;
          uVar8 = (ulong)(bVar17 || uVar11 < bVar16);
          uVar11 = uVar10 - uVar8;
          lVar9 = ((lVar9 - phi.high._8_8_) - (ulong)bVar15) - (ulong)(uVar10 < uVar8);
        }
        bVar15 = (__int128 *)0xfffffffffffffffe < p_Var14;
        p_Var14 = (__int128 *)((long)p_Var14 + 1);
      }
    }
    phi.high._0_8_ = uVar11 + local_128;
    phi.high._8_8_ = lVar9 + local_140 + (ulong)CARRY8(uVar11,local_128);
    phi.low._0_8_ = uVar7 + local_138;
    phi.low._8_8_ = uVar13 + local_130 + (ulong)CARRY8(uVar7,local_138);
    if (CARRY8(uVar13,local_130) || CARRY8(uVar13 + local_130,(ulong)CARRY8(uVar7,local_138))) {
      bVar15 = 0xfffffffffffffffe < (ulong)phi.high;
      phi.high._0_8_ = (ulong)phi.high + 1;
      phi.high._8_8_ = phi.high._8_8_ + (ulong)bVar15;
    }
    x_03._8_8_ = lVar19;
    x_03._0_8_ = in_stack_fffffffffffffe88;
    P2(&p2,this,(int128_t)x_03,(int64_t)in_RDX,(int)__return_storage_ptr___00);
    prime_sum_tiny(__return_storage_ptr___00,(int64_t)this);
    x_04._8_8_ = lVar19;
    x_04._0_8_ = in_stack_fffffffffffffe88;
    int256_t::operator+(&local_58,&phi,(__int128)x_04);
    int256_t::operator-(&local_78,&local_58,1);
    lVar9 = (ulong)local_78.high - (ulong)p2.high;
    lVar6 = (local_78.high._8_8_ - p2.high._8_8_) - (ulong)((ulong)local_78.high < (ulong)p2.high);
    *(long *)((long)&__return_storage_ptr__->high + 8) = lVar6;
    *(long *)&__return_storage_ptr__->high = lVar9;
    *(ulong *)&__return_storage_ptr__->low = (ulong)local_78.low - (ulong)p2.low;
    *(ulong *)((long)&__return_storage_ptr__->low + 8) =
         (local_78.low._8_8_ - p2.low._8_8_) - (ulong)((ulong)local_78.low < (ulong)p2.low);
    if (local_78.low._8_8_ < p2.low._8_8_ ||
        local_78.low._8_8_ - p2.low._8_8_ < (ulong)((ulong)local_78.low < (ulong)p2.low)) {
      *(long *)&__return_storage_ptr__->high = lVar9 + -1;
      *(ulong *)((long)&__return_storage_ptr__->high + 8) = lVar6 + -1 + (ulong)(lVar9 != 0);
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&mu.super__Vector_base<int,_std::allocator<int>_>);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&lpf.super__Vector_base<int,_std::allocator<int>_>);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&primes.super__Vector_base<int,_std::allocator<int>_>);
  }
  else {
    *(undefined8 *)&__return_storage_ptr__->high = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->high + 8) = 0;
    *(undefined8 *)&__return_storage_ptr__->low = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->low + 8) = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

int256_t pi_lmo1(int128_t x)
{
  if (x < 2)
    return 0;

  int64_t y = iroot<3>(x); 
  int64_t pi_y = pi_legendre(y, 1);
  int64_t c = PhiTiny::get_c(y);
  int256_t S1 = 0;
  int256_t S2 = 0;

  vector<int32_t> primes = generate_primes(y);
  vector<int32_t> lpf = generate_lpf(y);
  vector<int32_t> mu = generate_moebius(y);

  // Calculate the contribution of the ordinary leaves
  for (int64_t n = 1; n <= y; n++)
    if (lpf[n] > primes[c])
      S1 += phi_sum(x / n, c) * (mu[n] * n);
  
  // Calculate the contribution of the special leaves
  for (int64_t b = c + 1; b < pi_y; b++)
    for (int128_t m = (y / primes[b]) + 1; m <= y; m++)
      if (lpf[m] > primes[b])
        S2 -= phi_sum(x / (primes[b] * m), b - 1) * (mu[m] * m * primes[b]);

  int256_t phi = S1 + S2;
  int256_t p2 = P2(x, y, 1);
  int256_t sum = phi + prime_sum_tiny(y) - 1 - p2;

  return sum;
}